

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_writer.cpp
# Opt level: O3

void __thiscall
duckdb::ListColumnWriter::Prepare
          (ListColumnWriter *this,ColumnWriterState *state_p,ColumnWriterState *parent,
          Vector *vector,idx_t count)

{
  unsafe_vector<uint16_t> *this_00;
  unsafe_vector<uint16_t> *this_01;
  vector<bool,_true> *this_02;
  pointer *ppuVar1;
  unsigned_short uVar2;
  data_ptr_t pdVar3;
  pointer puVar4;
  unsigned_long *puVar5;
  long lVar6;
  unsigned_short uVar7;
  Vector *other;
  pointer pCVar8;
  type pCVar9;
  IOException *this_03;
  unsigned_short *puVar10;
  idx_t iVar11;
  iterator iVar12;
  ulong uVar13;
  idx_t iVar14;
  size_type __n;
  ulong *puVar15;
  reference rVar16;
  Vector child_list;
  ulong local_d0;
  Vector local_98;
  
  pdVar3 = vector->data;
  FlatVector::VerifyFlatVector(vector);
  iVar14 = count;
  if (parent != (ColumnWriterState *)0x0) {
    iVar14 = ((long)(parent->definition_levels).
                    super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(parent->definition_levels).
                    super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start >> 1) -
             (long)state_p[1].definition_levels.
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
  }
  if (iVar14 != 0) {
    this_00 = &state_p->definition_levels;
    this_01 = &state_p->repetition_levels;
    this_02 = &state_p->is_empty;
    local_d0 = 0;
    iVar11 = 0;
    do {
      if (parent == (ColumnWriterState *)0x0) {
        uVar7 = (unsigned_short)((this->super_ColumnWriter).column_schema)->max_repeat;
LAB_011335dd:
        puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 == (unsigned_long *)0x0) ||
           ((puVar5[local_d0 >> 6] >> (local_d0 & 0x3f) & 1) != 0)) {
          lVar6 = *(long *)(pdVar3 + local_d0 * 0x10 + 8);
          if (lVar6 == 0) {
            local_98._0_2_ = SUB82(((this->super_ColumnWriter).column_schema)->max_define,0);
            iVar12._M_current =
                 (state_p->definition_levels).
                 super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar12._M_current !=
                (state_p->definition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *iVar12._M_current = local_98._0_2_;
              goto LAB_0113364d;
            }
            ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
            _M_realloc_insert<unsigned_short>
                      (&this_00->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                       iVar12,(unsigned_short *)&local_98);
          }
          else {
            iVar12._M_current =
                 (state_p->definition_levels).
                 super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar12._M_current ==
                (state_p->definition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<unsigned_short,std::allocator<unsigned_short>>::
              _M_realloc_insert<unsigned_short_const&>
                        ((vector<unsigned_short,std::allocator<unsigned_short>> *)this_00,iVar12,
                         &ColumnWriter::PARQUET_DEFINE_VALID);
            }
            else {
              *iVar12._M_current = 0xffff;
LAB_0113364d:
              (state_p->definition_levels).
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar12._M_current + 1;
            }
          }
          ::std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)this_02,lVar6 == 0);
          local_98._0_2_ = uVar7;
          iVar12._M_current =
               (state_p->repetition_levels).
               super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar12._M_current ==
              (state_p->repetition_levels).
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
            _M_realloc_insert<unsigned_short>
                      (&this_01->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                       iVar12,(unsigned_short *)&local_98);
          }
          else {
            *iVar12._M_current = uVar7;
            (state_p->repetition_levels).
            super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar12._M_current + 1;
          }
          puVar15 = (ulong *)(pdVar3 + local_d0 * 0x10 + 8);
          if (1 < *puVar15) {
            uVar13 = 1;
            do {
              uVar7 = (short)(int)((this->super_ColumnWriter).column_schema)->max_repeat + 1;
              local_98._0_2_ = uVar7;
              iVar12._M_current =
                   (state_p->repetition_levels).
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar12._M_current ==
                  (state_p->repetition_levels).
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                _M_realloc_insert<unsigned_short>
                          (&this_01->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                           iVar12,(unsigned_short *)&local_98);
              }
              else {
                *iVar12._M_current = uVar7;
                (state_p->repetition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar12._M_current + 1;
              }
              iVar12._M_current =
                   (state_p->definition_levels).
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar12._M_current ==
                  (state_p->definition_levels).
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                ::std::vector<unsigned_short,std::allocator<unsigned_short>>::
                _M_realloc_insert<unsigned_short_const&>
                          ((vector<unsigned_short,std::allocator<unsigned_short>> *)this_00,iVar12,
                           &ColumnWriter::PARQUET_DEFINE_VALID);
              }
              else {
                *iVar12._M_current = 0xffff;
                (state_p->definition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar12._M_current + 1;
              }
              ::std::vector<bool,_std::allocator<bool>_>::push_back
                        ((vector<bool,_std::allocator<bool>_> *)this_02,false);
              uVar13 = uVar13 + 1;
            } while (uVar13 < *puVar15);
          }
        }
        else {
          if ((this->super_ColumnWriter).can_have_nulls == false) {
            this_03 = (IOException *)__cxa_allocate_exception(0x10);
            local_98._0_8_ = &local_98.type.type_info_;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_98,
                       "Parquet writer: map key column is not allowed to contain NULL values","");
            IOException::IOException(this_03,(string *)&local_98);
            __cxa_throw(this_03,&IOException::typeinfo,::std::runtime_error::~runtime_error);
          }
          local_98._0_2_ = (short)(int)((this->super_ColumnWriter).column_schema)->max_define - 1;
          iVar12._M_current =
               (state_p->definition_levels).
               super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar12._M_current ==
              (state_p->definition_levels).
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
            _M_realloc_insert<unsigned_short>
                      (&this_00->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                       iVar12,(unsigned_short *)&local_98);
          }
          else {
            *iVar12._M_current = local_98._0_2_;
LAB_01133684:
            (state_p->definition_levels).
            super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar12._M_current + 1;
          }
LAB_011337f5:
          local_98._0_2_ = uVar7;
          iVar12._M_current =
               (state_p->repetition_levels).
               super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar12._M_current ==
              (state_p->repetition_levels).
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
            _M_realloc_insert<unsigned_short>
                      (&this_01->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                       iVar12,(unsigned_short *)&local_98);
          }
          else {
            *iVar12._M_current = uVar7;
            (state_p->repetition_levels).
            super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar12._M_current + 1;
          }
          ::std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)this_02,true);
        }
        local_d0 = local_d0 + 1;
      }
      else {
        __n = (long)state_p[1].definition_levels.
                    super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + iVar11;
        if ((((parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
              super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
              super__Bit_iterator_base._M_p ==
              (parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
              super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
              super__Bit_iterator_base._M_p) &&
            ((parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
             super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
             super__Bit_iterator_base._M_offset == 0)) ||
           (rVar16 = vector<bool,_true>::get<true>(&parent->is_empty,__n),
           (*rVar16._M_p & rVar16._M_mask) == 0)) {
          puVar4 = (parent->repetition_levels).
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (puVar4 == (parent->repetition_levels).
                        super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
            uVar7 = (unsigned_short)((this->super_ColumnWriter).column_schema)->max_repeat;
          }
          else {
            uVar7 = puVar4[__n];
          }
          puVar4 = (parent->definition_levels).
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar2 = puVar4[__n];
          if (uVar2 == 0xffff) goto LAB_011335dd;
          iVar12._M_current =
               (state_p->definition_levels).
               super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar12._M_current !=
              (state_p->definition_levels).
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *iVar12._M_current = uVar2;
            goto LAB_01133684;
          }
          ::std::vector<unsigned_short,std::allocator<unsigned_short>>::
          _M_realloc_insert<unsigned_short_const&>
                    ((vector<unsigned_short,std::allocator<unsigned_short>> *)this_00,iVar12,
                     puVar4 + __n);
          goto LAB_011337f5;
        }
        puVar10 = (parent->definition_levels).
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_start + __n;
        iVar12._M_current =
             (state_p->definition_levels).
             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar12._M_current ==
            (state_p->definition_levels).
            super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_short,std::allocator<unsigned_short>>::
          _M_realloc_insert<unsigned_short_const&>
                    ((vector<unsigned_short,std::allocator<unsigned_short>> *)this_00,iVar12,puVar10
                    );
        }
        else {
          *iVar12._M_current = *puVar10;
          (state_p->definition_levels).super_vector<unsigned_short,_std::allocator<unsigned_short>_>
          .super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar12._M_current + 1;
        }
        puVar10 = (parent->repetition_levels).
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_start + __n;
        iVar12._M_current =
             (state_p->repetition_levels).
             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar12._M_current ==
            (state_p->repetition_levels).
            super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_short,std::allocator<unsigned_short>>::
          _M_realloc_insert<unsigned_short_const&>
                    ((vector<unsigned_short,std::allocator<unsigned_short>> *)this_01,iVar12,puVar10
                    );
        }
        else {
          *iVar12._M_current = *puVar10;
          (state_p->repetition_levels).super_vector<unsigned_short,_std::allocator<unsigned_short>_>
          .super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar12._M_current + 1;
        }
        ::std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)this_02,true);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar14);
  }
  ppuVar1 = &state_p[1].definition_levels.
             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  *ppuVar1 = (pointer)((long)*ppuVar1 + iVar14);
  other = ListVector::GetEntry(vector);
  Vector::Vector(&local_98,other);
  iVar14 = GetConsecutiveChildList(vector,&local_98,0,count);
  pCVar8 = unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>::
           operator->(&this->child_writer);
  pCVar9 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
           ::operator*((unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                        *)&state_p[1].definition_levels.
                           super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_finish);
  (*pCVar8->_vptr_ColumnWriter[6])(pCVar8,pCVar9,state_p,&local_98,iVar14);
  if (local_98.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType((LogicalType *)((long)&local_98 + 8));
  return;
}

Assistant:

void ListColumnWriter::Prepare(ColumnWriterState &state_p, ColumnWriterState *parent, Vector &vector, idx_t count) {
	auto &state = state_p.Cast<ListColumnWriterState>();

	auto list_data = FlatVector::GetData<list_entry_t>(vector);
	auto &validity = FlatVector::Validity(vector);

	// write definition levels and repeats
	idx_t start = 0;
	idx_t vcount = parent ? parent->definition_levels.size() - state.parent_index : count;
	idx_t vector_index = 0;
	for (idx_t i = start; i < vcount; i++) {
		idx_t parent_index = state.parent_index + i;
		if (parent && !parent->is_empty.empty() && parent->is_empty[parent_index]) {
			state.definition_levels.push_back(parent->definition_levels[parent_index]);
			state.repetition_levels.push_back(parent->repetition_levels[parent_index]);
			state.is_empty.push_back(true);
			continue;
		}
		auto first_repeat_level =
		    parent && !parent->repetition_levels.empty() ? parent->repetition_levels[parent_index] : MaxRepeat();
		if (parent && parent->definition_levels[parent_index] != PARQUET_DEFINE_VALID) {
			state.definition_levels.push_back(parent->definition_levels[parent_index]);
			state.repetition_levels.push_back(first_repeat_level);
			state.is_empty.push_back(true);
		} else if (validity.RowIsValid(vector_index)) {
			// push the repetition levels
			if (list_data[vector_index].length == 0) {
				state.definition_levels.push_back(MaxDefine());
				state.is_empty.push_back(true);
			} else {
				state.definition_levels.push_back(PARQUET_DEFINE_VALID);
				state.is_empty.push_back(false);
			}
			state.repetition_levels.push_back(first_repeat_level);
			for (idx_t k = 1; k < list_data[vector_index].length; k++) {
				state.repetition_levels.push_back(MaxRepeat() + 1);
				state.definition_levels.push_back(PARQUET_DEFINE_VALID);
				state.is_empty.push_back(false);
			}
		} else {
			if (!can_have_nulls) {
				throw IOException("Parquet writer: map key column is not allowed to contain NULL values");
			}
			state.definition_levels.push_back(MaxDefine() - 1);
			state.repetition_levels.push_back(first_repeat_level);
			state.is_empty.push_back(true);
		}
		vector_index++;
	}
	state.parent_index += vcount;

	auto &list_child = ListVector::GetEntry(vector);
	Vector child_list(list_child);
	auto child_length = GetConsecutiveChildList(vector, child_list, 0, count);
	child_writer->Prepare(*state.child_state, &state_p, child_list, child_length);
}